

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::PortConnection::checkSimulatedNetTypes(PortConnection *this)

{
  SymbolKind SVar1;
  NetKind NVar2;
  PortSymbol *this_00;
  SourceLocation SVar3;
  Type *this_01;
  bool bVar4;
  uint uVar5;
  Symbol *pSVar6;
  Diagnostic *pDVar7;
  NetType *pNVar8;
  int line;
  uint uVar9;
  pointer pNVar10;
  long lVar11;
  NetType *pNVar12;
  pointer pNVar13;
  uint uVar14;
  bool shouldWarn_1;
  Scope *scope;
  bool shouldWarn;
  anon_class_16_2_f87c7f41 requireMatching;
  SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> external;
  SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> internal;
  bool local_129;
  Scope *local_128;
  ulong local_120;
  uint local_118;
  bitwidth_t local_114;
  ulong local_110;
  char *local_108;
  PortConnection *local_100;
  pointer local_f8;
  anon_class_16_2_f87c7f41 local_f0;
  SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> local_e0 [2];
  SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> local_88 [2];
  
  getExpression(this);
  if (this->expr == (Expression *)0x0) {
    return;
  }
  bVar4 = Expression::bad(this->expr);
  if (bVar4) {
    return;
  }
  local_88[0].data_ = (pointer)local_88[0].firstElement;
  local_88[0].len = 0;
  local_88[0].cap = 4;
  this_00 = (PortSymbol *)this->port;
  SVar1 = (this_00->super_Symbol).kind;
  if (SVar1 == MultiPort) {
    SVar3 = this_00->externalLoc;
    if (SVar3 != (SourceLocation)0x0) {
      pSVar6 = this_00->internalSymbol;
      lVar11 = 0;
      do {
        PortSymbol::getNetTypes(*(PortSymbol **)((long)&pSVar6->kind + lVar11),local_88);
        lVar11 = lVar11 + 8;
      } while ((long)SVar3 << 3 != lVar11);
    }
  }
  else {
    if (SVar1 != Port) {
      assert::assertFailed
                ("T::isKind(kind)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                 ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::MultiPortSymbol]");
    }
    PortSymbol::getNetTypes(this_00,local_88);
  }
  local_e0[0].data_ = (pointer)local_e0[0].firstElement;
  local_e0[0].len = 0;
  local_e0[0].cap = 4;
  getNetRanges(this->expr,local_e0);
  if (local_e0[0].len == 0 && local_88[0].len == 0) goto LAB_001d8baf;
  local_128 = (this->parentInstance->super_InstanceSymbolBase).super_Symbol.parentScope;
  if (local_128 == (Scope *)0x0) {
    assert::assertFailed
              ("scope",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/PortSymbols.cpp"
               ,0x739,"void slang::ast::PortConnection::checkSimulatedNetTypes() const");
  }
  if (((local_88[0].len == 1) && ((local_88[0].data_)->netType->netKind == Interconnect)) &&
     (pSVar6 = findAnyVars(this->expr), pSVar6 != (Symbol *)0x0)) {
    pDVar7 = Scope::addDiag(local_128,(DiagCode)0x3c0006,this->expr->sourceRange);
    Diagnostic::operator<<(pDVar7,pSVar6->name);
    goto LAB_001d8baf;
  }
  pNVar10 = local_88[0].data_;
  pNVar13 = local_e0[0].data_;
  local_f0.scope = &local_128;
  local_f0.this = this;
  if ((local_88[0].len == 0) || (local_e0[0].len == 0)) {
    if (local_88[0].len != 0) {
      lVar11 = 0;
      do {
        pNVar8 = *(NetType **)((long)&(local_88[0].data_)->netType + lVar11);
        if (pNVar8->netKind == UserDefined) goto LAB_001d889e;
        lVar11 = lVar11 + 0x10;
      } while (local_88[0].len << 4 != lVar11);
    }
    pNVar8 = (NetType *)0x0;
LAB_001d889e:
    pNVar12 = pNVar8;
    if (local_e0[0].len != 0) {
      lVar11 = 0;
      do {
        pNVar12 = *(NetType **)((long)&(local_e0[0].data_)->netType + lVar11);
        if (pNVar12->netKind == UserDefined) break;
        lVar11 = lVar11 + 0x10;
        pNVar12 = pNVar8;
      } while (local_e0[0].len << 4 != lVar11);
    }
    if (pNVar12 != (NetType *)0x0) {
      checkSimulatedNetTypes::anon_class_16_2_f87c7f41::operator()(&local_f0,pNVar12);
    }
    goto LAB_001d8baf;
  }
  if (local_e0[0].len != 1 || local_88[0].len != 1) {
    this_01 = (this->expr->type).ptr;
    if (this_01 == (Type *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,
                 "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]"
                );
    }
    local_114 = Type::getBitWidth(this_01);
    local_118 = 0;
    local_108 = "exprWidth >= currBit + width";
    local_110 = 0;
    local_100 = this;
    do {
      pNVar8 = pNVar10->netType;
      pNVar12 = pNVar13->netType;
      if ((pNVar8->netKind == UserDefined) || (pNVar12->netKind == UserDefined)) {
        if (pNVar8 == pNVar12) {
          local_129 = false;
          goto LAB_001d89a5;
        }
        pDVar7 = Scope::addDiag(local_128,(DiagCode)0x9a0006,this->expr->sourceRange);
        pDVar7 = Diagnostic::operator<<(pDVar7,(pNVar8->super_Symbol).name);
        Diagnostic::operator<<(pDVar7,(pNVar12->super_Symbol).name);
LAB_001d8b06:
        bVar4 = false;
      }
      else {
        NetType::getSimulatedNetType(pNVar8,pNVar12,&local_129);
LAB_001d89a5:
        uVar5 = pNVar10->width;
        uVar14 = pNVar13->width;
        if (uVar5 < uVar14) {
          pNVar13->width = uVar14 - uVar5;
          pNVar10 = pNVar10 + 1;
          uVar14 = uVar5;
        }
        else {
          pNVar13 = pNVar13 + 1;
          if (uVar5 - uVar14 == 0) {
            pNVar10 = pNVar10 + 1;
          }
          else {
            pNVar10->width = uVar5 - uVar14;
          }
        }
        local_f8 = pNVar10;
        if (local_129 == true) {
          uVar5 = (int)local_110 + uVar14;
          uVar9 = local_114 - uVar5;
          if (local_114 < uVar5) {
            line = 0x7ce;
            goto LAB_001d8c02;
          }
          pDVar7 = Scope::addDiag(local_128,(DiagCode)0xb00006,local_100->expr->sourceRange);
          Diagnostic::operator<<(pDVar7,(pNVar12->super_Symbol).name);
          local_120 = (ulong)(~(uint)local_110 + local_114);
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
          ::emplace_back<unsigned_long>(&pDVar7->args,&local_120);
          local_120 = (ulong)uVar9;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
          ::emplace_back<unsigned_long>(&pDVar7->args,&local_120);
          Diagnostic::operator<<(pDVar7,(pNVar8->super_Symbol).name);
          if ((local_118 & 1) == 0) {
            local_118 = (uint)CONCAT71((int7)((ulong)local_100->port >> 8),1);
            Diagnostic::addNote(pDVar7,(DiagCode)0x40001,local_100->port->location);
          }
        }
        pNVar10 = local_f8;
        this = local_100;
        if (local_f8 == local_88[0].data_ + local_88[0].len) {
LAB_001d8aef:
          if (pNVar13 != local_e0[0].data_ + local_e0[0].len) {
LAB_001d8bea:
            line = 0x7de;
            local_108 = "in == internal.end() && ex == external.end()";
LAB_001d8c02:
            assert::assertFailed
                      (local_108,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/PortSymbols.cpp"
                       ,line,"void slang::ast::PortConnection::checkSimulatedNetTypes() const");
          }
          goto LAB_001d8b06;
        }
        if (pNVar13 == local_e0[0].data_ + local_e0[0].len) {
          if (local_f8 == local_88[0].data_ + local_88[0].len) goto LAB_001d8aef;
          goto LAB_001d8bea;
        }
        local_110 = (ulong)(uVar14 + (int)local_110);
        bVar4 = true;
      }
    } while (bVar4);
    goto LAB_001d8baf;
  }
  pNVar8 = (local_88[0].data_)->netType;
  pNVar12 = (local_e0[0].data_)->netType;
  if (pNVar8 == pNVar12) goto LAB_001d8baf;
  NVar2 = pNVar8->netKind;
  if (NVar2 == UserDefined) {
LAB_001d8825:
    if (pNVar12->netKind == UserDefined) {
      pDVar7 = Scope::addDiag(local_128,(DiagCode)0x9b0006,this->expr->sourceRange);
      pDVar7 = Diagnostic::operator<<(pDVar7,(pNVar8->super_Symbol).name);
      Diagnostic::operator<<(pDVar7,(pNVar12->super_Symbol).name);
      goto LAB_001d8baf;
    }
    if (NVar2 != UserDefined) goto LAB_001d8b2f;
  }
  else {
    if (pNVar12->netKind != UserDefined) {
      NetType::getSimulatedNetType(pNVar8,pNVar12,(bool *)&local_120);
      if (local_120._0_1_ == true) {
        pDVar7 = Scope::addDiag(local_128,(DiagCode)0xaf0006,this->expr->sourceRange);
        Diagnostic::operator<<(pDVar7,(pNVar12->super_Symbol).name);
        Diagnostic::operator<<(pDVar7,(pNVar8->super_Symbol).name);
        Diagnostic::addNote(pDVar7,(DiagCode)0x40001,this->port->location);
      }
      goto LAB_001d8baf;
    }
    if (NVar2 == UserDefined) goto LAB_001d8825;
LAB_001d8b2f:
    pNVar8 = pNVar12;
  }
  checkSimulatedNetTypes::anon_class_16_2_f87c7f41::operator()(&local_f0,pNVar8);
LAB_001d8baf:
  if (local_e0[0].data_ != (pointer)local_e0[0].firstElement) {
    free(local_e0[0].data_);
  }
  if (local_88[0].data_ != (pointer)local_88[0].firstElement) {
    free(local_88[0].data_);
  }
  return;
}

Assistant:

void PortConnection::checkSimulatedNetTypes() const {
    getExpression();
    if (!expr || expr->bad())
        return;

    SmallVector<PortSymbol::NetTypeRange, 4> internal;
    if (port.kind == SymbolKind::Port)
        port.as<PortSymbol>().getNetTypes(internal);
    else {
        for (auto p : port.as<MultiPortSymbol>().ports)
            p->getNetTypes(internal);
    }

    SmallVector<PortSymbol::NetTypeRange, 4> external;
    getNetRanges(*expr, external);

    // There might not be any nets, in which case we should just leave.
    if (internal.empty() && external.empty())
        return;

    auto scope = parentInstance.getParentScope();
    ASSERT(scope);

    // Do additional checking on the expression for interconnect port connections.
    if (internal.size() == 1 && internal[0].netType->netKind == NetType::Interconnect) {
        if (auto sym = findAnyVars(*expr)) {
            scope->addDiag(diag::InterconnectPortVar, expr->sourceRange) << sym->name;
            return;
        }
    }

    auto requireMatching = [&](const NetType& udnt) {
        // Types are more restricted; they must match instead of just being
        // assignment compatible. Also direction must be input or output.
        // We need to do this dance to get at the type of the connection prior
        // to it being converted to match the type of the port.
        auto exprType = expr->type.get();
        if (expr->kind == ExpressionKind::Conversion) {
            auto& conv = expr->as<ConversionExpression>();
            if (conv.isImplicit())
                exprType = conv.operand().type;
        }
        else if (expr->kind == ExpressionKind::Assignment) {
            auto& assign = expr->as<AssignmentExpression>();
            if (assign.isLValueArg())
                exprType = assign.left().type;
        }

        auto [direction, type] = getDirAndType(port);
        if (!type->isMatching(*exprType)) {
            // If this is from an interconnect connection, don't require matching types.
            auto isInterconnect = [](const Type& t) {
                auto curr = &t;
                while (curr->isArray())
                    curr = curr->getArrayElementType();

                return curr->isUntypedType();
            };

            if (isInterconnect(*type) || isInterconnect(*exprType))
                return;

            auto& diag = scope->addDiag(diag::MismatchedUserDefPortConn, expr->sourceRange);
            diag << udnt.name;
            diag << *type;
            diag << *exprType;
        }
        else if (direction != ArgumentDirection::In && direction != ArgumentDirection::Out) {
            auto& diag = scope->addDiag(diag::MismatchedUserDefPortDir, expr->sourceRange);
            diag << udnt.name;
        }
    };

    // If only one side has net types, check for user-defined nettypes,
    // which impose additional restrictions on the connection.
    if (internal.empty() || external.empty()) {
        const NetType* udnt = nullptr;
        auto checker = [&](auto& list) {
            for (auto& ntr : list) {
                if (!ntr.netType->isBuiltIn()) {
                    udnt = ntr.netType;
                    break;
                }
            }
        };

        checker(internal);
        checker(external);
        if (udnt)
            requireMatching(*udnt);

        return;
    }

    // Simple case is one net connected on each side.
    if (internal.size() == 1 && external.size() == 1) {
        auto& inNt = *internal[0].netType;
        auto& exNt = *external[0].netType;
        if (&inNt == &exNt)
            return;

        if (!inNt.isBuiltIn() || !exNt.isBuiltIn()) {
            // If both sides are user-defined nettypes they need to match.
            if (!inNt.isBuiltIn() && !exNt.isBuiltIn()) {
                auto& diag = scope->addDiag(diag::UserDefPortTwoSided, expr->sourceRange);
                diag << inNt.name << exNt.name;
            }
            else if (!inNt.isBuiltIn()) {
                requireMatching(inNt);
            }
            else {
                requireMatching(exNt);
            }
        }
        else {
            // Otherwise both sides are built-in nettypes.
            bool shouldWarn;
            NetType::getSimulatedNetType(inNt, exNt, shouldWarn);
            if (shouldWarn) {
                auto& diag = scope->addDiag(diag::NetInconsistent, expr->sourceRange);
                diag << exNt.name;
                diag << inNt.name;
                diag.addNote(diag::NoteDeclarationHere, port.location);
            }
        }

        return;
    }

    // Otherwise we need to compare ranges of net types for differences.
    auto in = internal.begin();
    auto ex = external.begin();
    bitwidth_t currBit = 0;
    bitwidth_t exprWidth = expr->type->getBitWidth();
    bool shownDeclaredHere = false;

    while (true) {
        bool shouldWarn;
        auto& inNt = *in->netType;
        auto& exNt = *ex->netType;

        if (!inNt.isBuiltIn() || !exNt.isBuiltIn()) {
            if (&inNt != &exNt) {
                scope->addDiag(diag::UserDefPortMixedConcat, expr->sourceRange)
                    << inNt.name << exNt.name;
                return;
            }
            shouldWarn = false;
        }
        else {
            NetType::getSimulatedNetType(inNt, exNt, shouldWarn);
        }

        bitwidth_t width;
        if (in->width < ex->width) {
            width = in->width;
            ex->width -= width;
            in++;
        }
        else {
            width = ex->width;
            ex++;

            if (in->width == width)
                in++;
            else
                in->width -= width;
        }

        if (shouldWarn) {
            ASSERT(exprWidth >= currBit + width);
            bitwidth_t left = exprWidth - currBit - 1;
            bitwidth_t right = left - (width - 1);

            auto& diag = scope->addDiag(diag::NetRangeInconsistent, expr->sourceRange);
            diag << exNt.name;
            diag << left << right;
            diag << inNt.name;

            if (!shownDeclaredHere) {
                diag.addNote(diag::NoteDeclarationHere, port.location);
                shownDeclaredHere = true;
            }
        }

        if (in == internal.end() || ex == external.end()) {
            ASSERT(in == internal.end() && ex == external.end());
            break;
        }

        currBit += width;
    }
}